

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

ProducerBase * __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
add_producer(ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
             *this,ProducerBase *producer)

{
  __pointer_type pPVar1;
  __pointer_type pPVar2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  bool bVar4;
  
  if (producer != (ProducerBase *)0x0) {
    LOCK();
    (this->producerCount).super___atomic_base<unsigned_int>._M_i =
         (this->producerCount).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    pPVar1 = (this->producerListTail)._M_b._M_p;
    do {
      pCVar3 = &pPVar1->super_ConcurrentQueueProducerTypelessBase;
      if (pPVar1 == (__pointer_type)0x0) {
        pCVar3 = (ConcurrentQueueProducerTypelessBase *)0x0;
      }
      (producer->super_ConcurrentQueueProducerTypelessBase).next = pCVar3;
      LOCK();
      pPVar2 = (this->producerListTail)._M_b._M_p;
      bVar4 = pPVar1 == pPVar2;
      if (bVar4) {
        (this->producerListTail)._M_b._M_p = producer;
        pPVar2 = pPVar1;
      }
      UNLOCK();
      pPVar1 = pPVar2;
    } while (!bVar4);
  }
  return producer;
}

Assistant:

ProducerBase* add_producer(ProducerBase* producer)
	{
		// Handle failed memory allocation
		if (producer == nullptr) {
			return nullptr;
		}
		
		producerCount.fetch_add(1, std::memory_order_relaxed);
		
		// Add it to the lock-free list
		auto prevTail = producerListTail.load(std::memory_order_relaxed);
		do {
			producer->next = prevTail;
		} while (!producerListTail.compare_exchange_weak(prevTail, producer, std::memory_order_release, std::memory_order_relaxed));
		
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
		if (producer->isExplicit) {
			auto prevTailExplicit = explicitProducers.load(std::memory_order_relaxed);
			do {
				static_cast<ExplicitProducer*>(producer)->nextExplicitProducer = prevTailExplicit;
			} while (!explicitProducers.compare_exchange_weak(prevTailExplicit, static_cast<ExplicitProducer*>(producer), std::memory_order_release, std::memory_order_relaxed));
		}
		else {
			auto prevTailImplicit = implicitProducers.load(std::memory_order_relaxed);
			do {
				static_cast<ImplicitProducer*>(producer)->nextImplicitProducer = prevTailImplicit;
			} while (!implicitProducers.compare_exchange_weak(prevTailImplicit, static_cast<ImplicitProducer*>(producer), std::memory_order_release, std::memory_order_relaxed));
		}
#endif
		
		return producer;
	}